

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  int iVar1;
  secp256k1_scalar tmp;
  secp256k1_scalar local_48;
  
  local_48.d[0] = s1->d[0];
  local_48.d[1] = s1->d[1];
  local_48.d[2] = s1->d[2];
  local_48.d[3] = s1->d[3];
  secp256k1_scalar_split_lambda(s1,s2,&local_48);
  secp256k1_ge_mul_lambda(p2,p1);
  iVar1 = secp256k1_scalar_is_high(s1);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(s1,s1);
    secp256k1_ge_neg(p1,p1);
  }
  iVar1 = secp256k1_scalar_is_high(s2);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(s2,s2);
    secp256k1_ge_neg(p2,p2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}